

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_increase_indent(yaml_emitter_t *emitter,int flow,int indentless)

{
  int **top;
  int iVar1;
  int *piVar2;
  
  piVar2 = (emitter->indents).top;
  if (piVar2 == (emitter->indents).end) {
    top = &(emitter->indents).top;
    iVar1 = yaml_stack_extend(&(emitter->indents).start,top,&(emitter->indents).end);
    if (iVar1 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      return 0;
    }
    piVar2 = *top;
  }
  iVar1 = emitter->indent;
  (emitter->indents).top = piVar2 + 1;
  *piVar2 = iVar1;
  if (iVar1 < 0) {
    if (flow == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = emitter->best_indent;
    }
    emitter->indent = iVar1;
  }
  else if (indentless == 0) {
    emitter->indent = iVar1 + emitter->best_indent;
  }
  return 1;
}

Assistant:

static int
yaml_emitter_increase_indent(yaml_emitter_t *emitter,
        int flow, int indentless)
{
    if (!PUSH(emitter, emitter->indents, emitter->indent))
        return 0;

    if (emitter->indent < 0) {
        emitter->indent = flow ? emitter->best_indent : 0;
    }
    else if (!indentless) {
        emitter->indent += emitter->best_indent;
    }

    return 1;
}